

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiResponse.cpp
# Opt level: O0

void __thiscall xmrig::HttpApiResponse::end(HttpApiResponse *this)

{
  bool bVar1;
  int iVar2;
  http_status s;
  SizeType SVar3;
  HttpResponse *in_RDI;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  size_t in_stack_00000180;
  char *in_stack_00000188;
  HttpResponse *in_stack_00000190;
  CrtAllocator *in_stack_fffffffffffffd78;
  CrtAllocator *in_stack_fffffffffffffd80;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_stack_fffffffffffffd88;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffd90;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *handler;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  StringRefType *value;
  StringRefType *name;
  allocator *key;
  HttpResponse *in_stack_fffffffffffffe00;
  undefined1 local_1b8 [56];
  string local_180 [39];
  allocator local_159;
  string local_158 [87];
  undefined1 local_101 [40];
  undefined1 local_d9 [40];
  undefined1 local_b1 [40];
  undefined1 local_89 [40];
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [40];
  
  key = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Access-Control-Allow-Origin",key);
  name = (StringRefType *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"*",(allocator *)name);
  HttpResponse::setHeader(in_stack_fffffffffffffe00,(string *)key,(string *)in_RDI);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  value = (StringRefType *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),"Access-Control-Allow-Methods",(allocator *)value);
  allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_b1 + 1),"GET, PUT, POST, DELETE",(allocator *)allocator_00);
  HttpResponse::setHeader(in_stack_fffffffffffffe00,(string *)key,(string *)in_RDI);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  handler = (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d9 + 1),"Access-Control-Allow-Headers",(allocator *)handler);
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_101 + 1),"Authorization, Content-Type",(allocator *)allocator);
  HttpResponse::setHeader(in_stack_fffffffffffffe00,(string *)key,(string *)in_RDI);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  iVar2 = HttpResponse::statusCode(in_RDI);
  if (399 < iVar2) {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(in_stack_fffffffffffffd90,(Ch *)in_stack_fffffffffffffd88);
    if (!bVar1) {
      rapidjson::StringRef<char>((char *)in_stack_fffffffffffffd78);
      HttpResponse::statusCode(in_RDI);
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)(in_RDI + 1));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)value,(StringRefType *)allocator_00,(int)((ulong)handler >> 0x20),
                       allocator);
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(in_stack_fffffffffffffd90,(Ch *)in_stack_fffffffffffffd88);
    if (!bVar1) {
      rapidjson::StringRef<char>((char *)in_stack_fffffffffffffd78);
      s = HttpResponse::statusCode(in_RDI);
      http_status_str(s);
      rapidjson::StringRef<char>((char *)in_stack_fffffffffffffd78);
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)(in_RDI + 1));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_RDI,name,value,allocator_00);
    }
  }
  SVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)(in_RDI + 1));
  if (SVar3 == 0) {
    HttpResponse::end(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"Content-Type",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"application/json",(allocator *)(local_1b8 + 0x37));
    HttpResponse::setHeader(in_stack_fffffffffffffe00,(string *)key,(string *)in_RDI);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)(local_1b8 + 0x37));
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    this_00 = (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *)local_1b8;
    rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0x1e2f15);
    rapidjson::
    PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::PrettyWriter(this_00,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                   (size_t)in_stack_fffffffffffffd78);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetMaxDecimalPlaces
              ((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)&stack0xfffffffffffffe00,10);
    rapidjson::
    PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)&stack0xfffffffffffffe00,kFormatSingleLineArray);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)allocator_00,handler);
    rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
              (in_stack_fffffffffffffd88);
    rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
              ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x1e2f94);
    HttpResponse::end(in_stack_00000190,in_stack_00000188,in_stack_00000180);
    rapidjson::
    PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::~PrettyWriter((PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                     *)0x1e2fbe);
    rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    ~GenericStringBuffer
              ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x1e2fcb);
  }
  return;
}

Assistant:

void xmrig::HttpApiResponse::end()
{
    using namespace rapidjson;

    setHeader("Access-Control-Allow-Origin", "*");
    setHeader("Access-Control-Allow-Methods", "GET, PUT, POST, DELETE");
    setHeader("Access-Control-Allow-Headers", "Authorization, Content-Type");

    if (statusCode() >= 400) {
        if (!m_doc.HasMember(kStatus)) {
            m_doc.AddMember(StringRef(kStatus), statusCode(), m_doc.GetAllocator());
        }

        if (!m_doc.HasMember(kError)) {
            m_doc.AddMember(StringRef(kError), StringRef(http_status_str(static_cast<http_status>(statusCode()))), m_doc.GetAllocator());
        }
    }

    if (!m_doc.MemberCount()) {
        return HttpResponse::end();
    }

    setHeader("Content-Type", "application/json");

    StringBuffer buffer(nullptr, 4096);
    PrettyWriter<StringBuffer> writer(buffer);
    writer.SetMaxDecimalPlaces(10);
    writer.SetFormatOptions(kFormatSingleLineArray);

    m_doc.Accept(writer);

    HttpResponse::end(buffer.GetString(), buffer.GetSize());
}